

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safeint-test.cc
# Opt level: O3

void __thiscall SafeIntTest_Ctor_Test::TestBody(SafeIntTest_Ctor_Test *this)

{
  bool bVar1;
  undefined8 *puVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertHelper local_28;
  AssertHelper local_20;
  Message local_18;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_28.data_._0_4_ = 0x2a;
  local_20.data_._0_4_ = 0x2a;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_18,"42","val(n)",(int *)&local_28,(int *)&local_20);
  if (local_18.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/safeint-test.cc",
               0x2d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) {
    testing::Message::Message(&local_18);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/safeint-test.cc",
               0x2e,
               "Expected: SafeInt<int>(2147483647 + 1u) throws an exception of type OverflowError.\n  Actual: it throws nothing."
              );
    testing::internal::AssertHelper::operator=(&local_28,&local_18);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (CONCAT71(local_18.ss_.ptr_._1_7_,local_18.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_18.ss_.ptr_._1_7_,local_18.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_18.ss_.ptr_._1_7_,local_18.ss_.ptr_._0_1_) + 8))();
      }
    }
    local_28.data_._0_4_ = 0x2a;
    local_20.data_._0_4_ = 0x2a;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_18,"42","val(SafeInt<int>(42u))",(int *)&local_28,(int *)&local_20
              );
    if (local_18.ss_.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_28);
      if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_10.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/safeint-test.cc",
                 0x2f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if (CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_28.data_._4_4_,local_28.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00145128;
  __cxa_throw(puVar2,&mp::OverflowError::typeinfo,std::exception::~exception);
}

Assistant:

TEST(SafeIntTest, Ctor) {
  SafeInt<int> n(42);
  EXPECT_EQ(42, val(n));
  EXPECT_THROW(SafeInt<int>(INT_MAX + 1u), OverflowError);
  EXPECT_EQ(42, val(SafeInt<int>(42u)));
}